

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

void Gia_ManFromIfGetConfig(Vec_Int_t *vConfigs,If_Man_t *pIfMan,If_Cut_t *pCutBest,int fCompl)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  float fVar4;
  char *pcVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  word *pwVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  
  uVar7 = pCutBest->iCutFunc;
  if ((int)uVar7 < 0) {
LAB_006f4c56:
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/if.h"
                  ,0x1a7,"int If_CutTruthLit(If_Cut_t *)");
  }
  uVar8 = pIfMan->vTtDsds[(byte)pCutBest->field_0x1f]->pArray[uVar7 >> 1];
  if ((int)uVar8 < 0) {
LAB_006f4c75:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf5,"int Abc_LitNotCond(int, int)");
  }
  pwVar10 = If_DsdManGetFuncConfig(pIfMan->pIfDsdMan,uVar8 ^ uVar7 & 1);
  if (pCutBest->iCutFunc < 0) {
LAB_006f4bbb:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf2,"int Abc_Lit2Var(int)");
  }
  bVar1 = pCutBest->field_0x1f;
  uVar17 = 6;
  if (6 < bVar1) {
    uVar17 = (ulong)(uint)bVar1;
  }
  lVar18 = uVar17 * ((uint)pCutBest->iCutFunc >> 1);
  if (pIfMan->vTtPerms[bVar1]->nSize <= (int)lVar18) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                  ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
  }
  pcVar5 = pIfMan->vTtPerms[bVar1]->pArray;
  uVar7 = If_DsdManVarNum(pIfMan->pIfDsdMan);
  uVar8 = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
  iVar9 = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
  uVar13 = iVar9 / (int)uVar7;
  if (vConfigs->nSize < 2) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar3 = vConfigs->pArray[1];
  iVar16 = iVar3;
  if (0 < iVar3) {
    do {
      Vec_IntPush(vConfigs,0);
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
    if (0 < iVar3) {
      iVar16 = vConfigs->nSize;
      uVar11 = iVar16 - iVar3;
      if (-1 < (int)uVar11) {
        if (iVar9 % (int)uVar7 != 0) {
          __assert_fail("nPermBitNum % nVarNum == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                        ,0x5f4,
                        "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int)");
        }
        piVar6 = vConfigs->pArray;
        if (0 < (int)uVar8) {
          uVar17 = 0;
          do {
            if ((pwVar10[(uVar17 >> 6) + 1] >> (uVar17 & 0x3f) & 1) != 0) {
              *(ulong *)(piVar6 + (ulong)uVar11 + (uVar17 >> 6) * 2) =
                   *(ulong *)(piVar6 + (ulong)uVar11 + (uVar17 >> 6) * 2) |
                   1L << ((byte)uVar17 & 0x3f);
            }
            uVar12 = (int)uVar17 + 1;
            uVar17 = (ulong)uVar12;
          } while (uVar8 != uVar12);
        }
        if (0 < (int)uVar7) {
          uVar17 = 0;
          uVar12 = uVar8;
          do {
            uVar14 = (uint)(*pwVar10 >> ((char)uVar17 * '\x04' & 0x3fU));
            uVar15 = *(uint *)&pCutBest->field_0x1c >> 0x18;
            if (uVar15 <= (uVar14 & 0xf)) {
              __assert_fail("Var < (int)pCutBest->nLeaves",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                            ,0x5fe,
                            "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int)")
              ;
            }
            cVar2 = pcVar5[(ulong)(uVar14 & 0xf) + lVar18];
            if (cVar2 < '\0') goto LAB_006f4bbb;
            uVar14 = (uint)(int)cVar2 >> 1;
            if (uVar15 <= uVar14) {
              __assert_fail("Abc_Lit2Var(Lit) < (int)pCutBest->nLeaves",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                            ,0x601,
                            "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int)")
              ;
            }
            fVar4 = (&pCutBest[1].Area)[uVar14];
            if (((long)(int)fVar4 < 0) || (pIfMan->vObjs->nSize <= (int)fVar4)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            uVar14 = *(uint *)((long)pIfMan->vObjs->pArray[(int)fVar4] + 0x40);
            if ((int)uVar14 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf3,"int Abc_LitIsCompl(int)");
            }
            if (0 < (int)uVar13) {
              uVar15 = 0;
              do {
                if (((uVar14 & 1 ^ (int)cVar2) >> (uVar15 & 0x1f) & 1) != 0) {
                  *(ulong *)(piVar6 + (ulong)uVar11 + (long)((int)(uVar12 + uVar15) >> 6) * 2) =
                       *(ulong *)(piVar6 + (ulong)uVar11 + (long)((int)(uVar12 + uVar15) >> 6) * 2)
                       | 1L << ((byte)(uVar12 + uVar15) & 0x3f);
                }
                uVar15 = uVar15 + 1;
              } while (uVar13 != uVar15);
            }
            uVar17 = uVar17 + 1;
            uVar12 = uVar12 + uVar13;
          } while (uVar17 != uVar7);
        }
        iVar9 = iVar9 + uVar8;
        if (iVar3 * 0x20 <= iVar9) {
          __assert_fail("nTtBitNum + nPermBitNum < 32 * nIntNum",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                        ,0x60b,
                        "void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int)");
        }
        uVar7 = pCutBest->iCutFunc;
        if ((int)uVar7 < 0) goto LAB_006f4c56;
        uVar8 = pIfMan->vTtDsds[*(uint *)&pCutBest->field_0x1c >> 0x18]->pArray[uVar7 >> 1];
        if (-1 < (int)uVar8) {
          if (((*(uint *)&pCutBest->field_0x1c >> 0xc ^ uVar7 ^ uVar8) & 1) != fCompl) {
            *(ulong *)(piVar6 + (ulong)uVar11 + (long)(iVar9 >> 6) * 2) =
                 *(ulong *)(piVar6 + (ulong)uVar11 + (long)(iVar9 >> 6) * 2) |
                 1L << ((byte)iVar9 & 0x3f);
          }
          if (iVar16 < 1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          *piVar6 = *piVar6 + 1;
          return;
        }
        goto LAB_006f4c75;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManFromIfGetConfig( Vec_Int_t * vConfigs, If_Man_t * pIfMan, If_Cut_t * pCutBest, int fCompl )
{
    If_Obj_t * pIfObj;
    word * pPerm = If_DsdManGetFuncConfig( pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest) ); // cell input -> DSD input
    char * pCutPerm = If_CutDsdPerm( pIfMan, pCutBest ); // DSD input -> cut input
    word * pArray;  int v, i, Lit, Var;
    int nVarNum = If_DsdManVarNum(pIfMan->pIfDsdMan);
    int nTtBitNum = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
    int nPermBitNum = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
    int nPermBitOne = nPermBitNum / nVarNum;
    // prepare storage
    int nIntNum = Vec_IntEntry( vConfigs, 1 );
    for ( i = 0; i < nIntNum; i++ )
        Vec_IntPush( vConfigs, 0 );
    pArray = (word *)Vec_IntEntryP( vConfigs, Vec_IntSize(vConfigs) - nIntNum );
    assert( nPermBitNum % nVarNum == 0 );
    // set truth table bits
    for ( i = 0; i < nTtBitNum; i++ )
        if ( Abc_TtGetBit(pPerm + 1, i) )
            Abc_TtSetBit( pArray, i );
    // set permutation bits
    for ( v = 0; v < nVarNum; v++ )
    {
        // get DSD variable
        Var = ((pPerm[0] >> (v * 4)) & 0xF);
        assert( Var < (int)pCutBest->nLeaves );
        // get AIG literal
        Lit = (int)pCutPerm[Var];
        assert( Abc_Lit2Var(Lit) < (int)pCutBest->nLeaves );
        // complement if polarity has changed
        pIfObj = If_ManObj( pIfMan, pCutBest->pLeaves[Abc_Lit2Var(Lit)] );
        Lit = Abc_LitNotCond( Lit, Abc_LitIsCompl(pIfObj->iCopy) );
        // create config literal
        for ( i = 0; i < nPermBitOne; i++ )
            if ( (Lit >> i) & 1 )
                Abc_TtSetBit( pArray, nTtBitNum + v * nPermBitOne + i );
    }
    // remember complementation
    assert( nTtBitNum + nPermBitNum < 32 * nIntNum );
    if ( Abc_LitIsCompl(If_CutDsdLit(pIfMan, pCutBest)) ^ pCutBest->fCompl ^ fCompl )
        Abc_TtSetBit( pArray, nTtBitNum + nPermBitNum );
    // update count
    Vec_IntAddToEntry( vConfigs, 0, 1 );
}